

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int av1_pack_bitstream(AV1_COMP *cpi,uint8_t *dst,size_t dst_size,size_t *size,int *largest_tile_id)

{
  ThreadData_conflict *pTVar1;
  FRAME_TYPE FVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  aom_metadata_t *paVar6;
  TileDataEnc *pTVar7;
  undefined6 uVar8;
  AV1_COMP *cpi_00;
  byte bVar9;
  uint32_t uVar10;
  int iVar11;
  aom_metadata_insert_flags_t aVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uchar *mem;
  size_t sVar17;
  size_t dest_size;
  TileBufferEnc *pTVar18;
  AV1_PRIMARY *pAVar19;
  ulong uVar20;
  aom_metadata_insert_flags_t aVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  AV1_PRIMARY *pAVar26;
  int tile_col;
  uint8_t *puVar27;
  byte *pbVar28;
  AV1_COMMON *pAVar29;
  uint uVar30;
  size_t cur_tile_size;
  AV1_COMP *pAVar31;
  ulong uVar32;
  aom_metadata_array_t *paVar33;
  int iVar34;
  uint uVar35;
  byte *pbVar36;
  uint uVar37;
  uchar *mem_1;
  bool bVar38;
  uint8_t *puVar39;
  byte *pbVar40;
  uint uVar41;
  size_t move_size;
  size_t i;
  ulong uVar42;
  long lVar43;
  float fVar44;
  float fVar45;
  size_t sStack_101c0;
  uint32_t total_size;
  AV1_COMP *pAStack_101b0;
  long lStack_101a8;
  byte *pbStack_101a0;
  AV1_PRIMARY *pAStack_10198;
  ulong uStack_10190;
  ulong uStack_10188;
  uint32_t obu_header_size;
  uint max_tile_size;
  MACROBLOCKD *pMStack_10178;
  TileBufferEnc *pTStack_10170;
  aom_metadata_array_t *paStack_10168;
  byte *pbStack_10160;
  AV1_COMMON *pAStack_10158;
  uint uStack_1014c;
  int *piStack_10148;
  byte *pbStack_10140;
  aom_write_bit_buffer saved_wb;
  long lStack_10118;
  byte *pbStack_10100;
  ulong uStack_100f8;
  long lStack_100f0;
  ulong uStack_100e8;
  uint32_t uStack_100dc;
  CommonTileParams *pCStack_100d8;
  byte *pbStack_100d0;
  FrameHeaderInfo fh_info;
  TileInfo tile_info;
  int unused;
  int tile_size_bytes_1;
  size_t curr_tg_data_size;
  byte bStack_10040;
  TileBufferEnc tile_buffers [64] [64];
  
  pAStack_10198 = cpi->ppi;
  fh_info.total_length = 0;
  fh_info.frame_header = (uint8_t *)0x0;
  fh_info.obu_header_byte_offset = 0;
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) && (cpi->deltaq_used == 0)) {
    (cpi->common).delta_q_info.delta_q_present_flag = 0;
  }
  iVar13 = (cpi->common).temporal_layer_id;
  iVar11 = (cpi->common).spatial_layer_id;
  cpi->frame_header_count = 0;
  pbVar28 = dst;
  pAStack_101b0 = cpi;
  piStack_10148 = largest_tile_id;
  lStack_101a8._0_4_ = iVar11;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    if (dst_size < 2) {
      return 1;
    }
    *dst = '\n';
    uVar10 = av1_write_sequence_header_obu((cpi->common).seq_params,dst + 1,dst_size);
    uVar42 = (ulong)uVar10;
    uStack_10190 = dst_size;
    sVar17 = obu_memmove(1,uVar42,dst,dst_size);
    if (sVar17 == 0) {
      return 1;
    }
    iVar11 = av1_write_uleb_obu_size(uVar42,dst + 1,sVar17);
    if (iVar11 != 0) {
      return 1;
    }
    dst_size = uStack_10190 - (sVar17 + uVar42 + 1);
    pbVar28 = dst + sVar17 + uVar42 + 1;
  }
  lStack_101a8 = CONCAT44(lStack_101a8._4_4_,(int)lStack_101a8 << 3 | iVar13 << 5);
  pAVar29 = &pAStack_101b0->common;
  pAVar31 = pAStack_101b0;
  pAStack_10158 = pAVar29;
  if ((pAStack_101b0->common).show_frame != 0) {
    if ((pAStack_101b0->source == (YV12_BUFFER_CONFIG *)0x0) ||
       (paVar33 = pAStack_101b0->source->metadata, paVar33 == (aom_metadata_array_t *)0x0)) {
      pTVar18 = (TileBufferEnc *)(uint8_t *)0x0;
    }
    else {
      pTStack_10170 = (TileBufferEnc *)0x0;
      pbVar40 = pbVar28;
      pbStack_101a0 = pbVar28;
      uStack_10190 = dst_size;
      uStack_10188 = dst_size;
      paStack_10168 = paVar33;
      for (uVar42 = 0; pTVar18 = pTStack_10170, dst_size = uStack_10190, uVar42 < paVar33->sz;
          uVar42 = uVar42 + 1) {
        paVar6 = paVar33->metadata_array[uVar42];
        if ((paVar6 != (aom_metadata_t *)0x0) && (paVar6->payload != (uint8_t *)0x0)) {
          aVar12 = paVar6->insert_flag;
          aVar21 = aVar12 & 0xf;
          FVar2 = (pAVar29->current_frame).frame_type;
          if (((FVar2 == '\0') && (aVar21 == AOM_MIF_KEY_FRAME)) ||
             (aVar21 == AOM_MIF_ANY_FRAME || aVar21 == AOM_MIF_NON_KEY_FRAME && FVar2 != '\0')) {
            if (uStack_10188 < 2) {
              aom_internal_error((pAVar31->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              aVar12 = paVar6->insert_flag;
            }
            bVar9 = (byte)((aVar12 & AOM_MIF_NON_KEY_FRAME_LAYER_SPECIFIC) >> 4) &
                    ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
            *pbVar40 = bVar9 * '\x04' | 0x2a;
            sVar17 = 1;
            if (bVar9 == 1) {
              pbVar40[1] = 0;
              sVar17 = 2;
            }
            pbVar28 = pbVar40 + sVar17;
            puVar39 = (uint8_t *)(uStack_10188 - sVar17);
            tile_buffers[0][0].data = (uint8_t *)0x0;
            pbStack_10160 = pbVar40;
            iVar13 = aom_uleb_encode((ulong)paVar6->type,(size_t)puVar39,pbVar28,
                                     (size_t *)tile_buffers);
            puVar27 = tile_buffers[0][0].data;
            if ((iVar13 == 0) && (tile_buffers[0][0].data + paVar6->sz + 1 <= puVar39)) {
              puVar39 = tile_buffers[0][0].data + (long)pbVar28;
              memcpy(puVar39,paVar6->payload,paVar6->sz);
              puVar39[paVar6->sz] = 0x80;
              puVar27 = puVar27 + paVar6->sz + 1;
              if (puVar27 == (uint8_t *)0x0) goto LAB_001935f1;
            }
            else {
LAB_001935f1:
              aom_internal_error((pAStack_101b0->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              puVar27 = (uint8_t *)0x0;
            }
            dest_size = obu_memmove(sVar17,(size_t)puVar27,pbStack_10160,uStack_10188);
            if (dest_size == 0) {
              aom_internal_error((pAStack_101b0->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
            }
            iVar13 = av1_write_uleb_obu_size((size_t)puVar27,pbVar28,dest_size);
            pAVar31 = pAStack_101b0;
            if (iVar13 == 0) {
              puVar27 = puVar27 + dest_size + sVar17;
              pbVar40 = pbStack_10160 + (long)puVar27;
              uStack_10188 = uStack_10188 - (long)puVar27;
              pTStack_10170 = (TileBufferEnc *)((long)pTStack_10170 + (long)puVar27);
              pbVar28 = pbStack_101a0;
              paVar33 = paStack_10168;
              pAVar29 = pAStack_10158;
            }
            else {
              aom_internal_error((pAStack_101b0->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              pbVar28 = pbStack_101a0;
              paVar33 = paStack_10168;
              pbVar40 = pbStack_10160;
              pAVar29 = pAStack_10158;
            }
          }
        }
      }
    }
    pbVar28 = pbVar28 + (long)pTVar18;
    dst_size = dst_size - (long)pTVar18;
  }
  if (pAVar31->num_tg < 2) {
    iVar13 = encode_show_existing_frame(pAVar29);
    saved_wb.bit_buffer = (uint8_t *)0x0;
    saved_wb.bit_offset = 0;
    saved_wb._12_4_ = 0;
    if (iVar13 != 0) goto LAB_00193708;
    sVar17 = 0;
    pbStack_101a0 = pbVar28;
  }
  else {
LAB_00193708:
    saved_wb.bit_offset = 0;
    saved_wb._12_4_ = 0;
    saved_wb.bit_buffer = (uint8_t *)0x0;
    if (dst_size < 2) {
      return 1;
    }
    _Var3 = ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
    if ((pAStack_10198->level_params).keep_level_stats != 0) {
      pAVar31->frame_header_count = pAVar31->frame_header_count + 1;
    }
    *pbVar28 = _Var3 * '\x04' | 0x1a;
    if (_Var3 == false) {
      sStack_101c0 = 1;
    }
    else {
      pbVar28[1] = (byte)lStack_101a8;
      sStack_101c0 = 2;
    }
    fh_info.frame_header = pbVar28;
    uVar10 = write_frame_header_obu
                       (pAVar31,&(pAVar31->td).mb.e_mbd,&saved_wb,pbVar28 + sStack_101c0,1);
    uVar42 = (ulong)uVar10;
    pbStack_101a0 = pbVar28;
    sVar17 = obu_memmove(sStack_101c0,uVar42,pbVar28,dst_size);
    if (sVar17 == 0) {
      return 1;
    }
    iVar13 = av1_write_uleb_obu_size(uVar42,pbVar28 + sStack_101c0,sVar17);
    if (iVar13 != 0) {
      return 1;
    }
    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = sVar17 + sStack_101c0 + uVar42;
    if (fh_info.total_length >> 0x20 != 0) {
      return 1;
    }
    pAVar31 = pAStack_101b0;
    pAVar29 = pAStack_10158;
    pbStack_101a0 = pbStack_101a0 + fh_info.total_length;
  }
  iVar13 = encode_show_existing_frame(pAVar29);
  cpi_00 = pAStack_101b0;
  if (iVar13 != 0) goto LAB_001943f2;
  if (saved_wb.bit_buffer != (uint8_t *)0x0) {
    saved_wb.bit_buffer = saved_wb.bit_buffer + sVar17;
  }
  *piStack_10148 = 0;
  if (((pAVar31->common).seg.enabled != '\0') && ((pAVar31->common).seg.update_map != '\0')) {
    if ((pAVar31->common).features.primary_ref_frame == 7) {
      bVar38 = false;
    }
    else {
      bVar38 = (pAVar31->td).rd_counts.seg_tmp_pred_cost[1] <=
               (pAVar31->td).rd_counts.seg_tmp_pred_cost[0];
    }
    (pAVar31->common).seg.temporal_update = bVar38;
  }
  pCStack_100d8 = &(pAVar31->common).tiles;
  if ((pAVar31->common).tiles.large_scale == 0) {
    total_size = 0;
    max_tile_size = 0;
    obu_header_size = 0;
    pbStack_10100 = pbStack_101a0;
    uVar16 = (pAVar31->common).tiles.cols;
    uVar37 = (pAVar31->common).tiles.rows;
    uVar14 = uVar37 * uVar16;
    if ((pAVar31->mt_info).pack_bs_mt_enabled == true) {
      lVar23 = 0;
      uVar42 = 0;
      if (0 < (int)uVar14) {
        uVar42 = (ulong)uVar14;
      }
      uVar25 = 0;
      for (; uVar42 * 0x5d10 - lVar23 != 0; lVar23 = lVar23 + 0x5d10) {
        uVar25 = uVar25 + *(long *)((long)pAVar31->tile_data->inter_mode_rd_models + lVar23 + -0x10)
        ;
      }
      fVar45 = 0.0;
      uVar41 = (pAVar31->mt_info).num_mod_workers[9];
      uVar30 = 1;
      while (uVar22 = uVar30, uVar30 = uVar41, fVar44 = fVar45, 1 < (int)uVar30) {
        uVar41 = uVar30 - 1;
        fVar45 = (float)(int)uVar30;
        fVar45 = (fVar45 * -5.0 + ((float)(int)uVar41 / fVar45) * (float)uVar25) -
                 (float)(int)uVar14 / fVar45;
        if (fVar45 <= fVar44) {
          fVar45 = fVar44;
          uVar30 = uVar22;
        }
      }
      if (uVar22 < 2) goto LAB_00193f76;
      av1_write_tile_obu_mt
                (pAVar31,pbStack_101a0,&total_size,&saved_wb,(byte)lStack_101a8,&fh_info,
                 piStack_10148,&max_tile_size,&obu_header_size,&pbStack_10100,uVar22);
    }
    else {
LAB_00193f76:
      pTVar1 = &pAVar31->td;
      pMStack_10178 = &(pAVar31->td).mb.e_mbd;
      pbStack_10140 =
           (byte *)CONCAT44(pbStack_10140._4_4_,
                            (int)(uVar14 + pAVar31->num_tg + -1) / pAVar31->num_tg);
      curr_tg_data_size = 0;
      tile_info.mi_row_start = 1;
      (pAVar31->td).coefficient_size = 0;
      (pAVar31->td).max_mv_magnitude = 0;
      (pAVar31->td).interp_filter_selected[0] = 0;
      (pAVar31->td).interp_filter_selected[1] = 0;
      (pAVar31->td).interp_filter_selected[2] = 0;
      (pAVar31->td).interp_filter_selected[3] = 0;
      pAStack_10158 = (AV1_COMMON *)0x0;
      if (0 < (int)uVar16) {
        pAStack_10158 = (AV1_COMMON *)(ulong)uVar16;
      }
      pAStack_10198 = (AV1_PRIMARY *)0x0;
      if ((int)uVar37 < 1) {
        uVar37 = 0;
      }
      uStack_100e8 = (ulong)uVar37;
      lStack_100f0 = (long)(int)uVar16 * 0x5d10;
      uStack_100f8 = (ulong)uVar16;
      pbVar28 = (byte *)0x20;
      uVar16 = 0;
      uVar37 = 1;
      iVar13 = 0;
      uVar42 = 0;
      pbVar40 = pbStack_101a0;
      while (pAVar31 = pAStack_101b0, uVar42 != uStack_100e8) {
        pTStack_10170 = (TileBufferEnc *)((long)pAStack_10198->parallel_cpi + (ulong)(1 - uVar14));
        pbVar36 = pbVar28;
        uStack_10190 = uVar42;
        for (pAVar29 = (AV1_COMMON *)0x0; pAStack_10158 != pAVar29;
            pAVar29 = (AV1_COMMON *)&(pAVar29->current_frame).reference_mode) {
          iVar13 = iVar13 + 1;
          if (uVar37 != 0) {
            iVar13 = 1;
          }
          uStack_10188 = CONCAT44(uStack_10188._4_4_,iVar13);
          tile_buffers[0][4].size._4_4_ = (int)pAVar29;
          bVar38 = (int)pTStack_10170 + tile_buffers[0][4].size._4_4_ == 0 ||
                   iVar13 == (int)pbStack_10140;
          (cpi_00->td).mb.e_mbd.tile_ctx =
               (FRAME_CONTEXT *)(pbVar36 + (long)(&cpi_00->tile_data->tctx + -1) + 0x52dc);
          paStack_10168 =
               (aom_metadata_array_t *)
               ((long)pAVar29->buffer_removal_times +
               (long)(pAStack_10198[-1].rtc_ref.buffer_time_index + 3));
          tile_buffers[0]._60_8_ = 0;
          if (uVar37 != 0) {
            pbVar40 = pbStack_101a0 + uVar16;
          }
          tile_buffers[0][2].data = pbStack_101a0;
          uVar16 = (uint)bVar38;
          tile_buffers[0][3].size._0_1_ = (undefined1)lStack_101a8;
          tile_buffers[0][0].data = (uint8_t *)&saved_wb;
          tile_buffers[0][4].size._0_4_ = (undefined4)uStack_10190;
          tile_buffers[0][1].size = (size_t)&total_size;
          pbStack_10160 = pbVar36;
          tile_buffers[0][2].size = (size_t)pbVar40;
          tile_buffers[0][5].data._0_4_ = uVar16;
          tile_buffers[0][5].data._4_4_ = uVar37;
          if (uVar37 == 0) {
            av1_pack_tile_info(cpi_00,pTVar1,(PackBSParams *)tile_buffers);
          }
          else {
            av1_write_obu_tg_tile_headers
                      (cpi_00,pMStack_10178,(PackBSParams *)tile_buffers,(int)paStack_10168);
            av1_pack_tile_info(cpi_00,pTVar1,(PackBSParams *)tile_buffers);
            curr_tg_data_size = (size_t)(int)tile_buffers[0][4].data;
            pbStack_10100 = pbStack_10100 + curr_tg_data_size;
            obu_header_size = tile_buffers[0][3].size._4_4_;
          }
          uVar42 = CONCAT44(tile_buffers[0][1].data._4_4_,(uint)tile_buffers[0][1].data);
          curr_tg_data_size = curr_tg_data_size + ((ulong)bVar38 ^ 1) * 4 + uVar42;
          if (max_tile_size < uVar42) {
            *piStack_10148 = (int)paStack_10168;
            max_tile_size = (uint)tile_buffers[0][1].data;
          }
          if (uVar16 != 0) {
            av1_write_last_tile_info
                      (pAStack_101b0,&fh_info,&saved_wb,&curr_tg_data_size,pbVar40,&total_size,
                       &pbStack_10100,piStack_10148,&tile_info.mi_row_start,obu_header_size,
                       (uint8_t)lStack_101a8);
            uVar42 = CONCAT44(tile_buffers[0][1].data._4_4_,(uint)tile_buffers[0][1].data);
          }
          uVar16 = (int)uVar42 + total_size;
          pbVar36 = pbStack_10160 + 0x5d10;
          uVar37 = (uint)bVar38;
          iVar13 = (int)uStack_10188;
          total_size = uVar16;
        }
        pbVar28 = pbVar28 + lStack_100f0;
        pAStack_10198 = (AV1_PRIMARY *)((long)pAStack_10198->parallel_cpi + uStack_100f8);
        uVar42 = uStack_10190 + 1;
      }
      av1_accumulate_pack_bs_thread_data(pAStack_101b0,pTVar1);
    }
    pbVar28 = pbStack_10100;
    uVar16 = max_tile_size;
    uVar10 = obu_header_size;
    if (1 < (int)uVar14) {
      uVar42 = (ulong)obu_header_size;
      aom_wb_overwrite_literal
                (&saved_wb,*piStack_10148,
                 (pAVar31->common).tiles.log2_rows + (pAVar31->common).tiles.log2_cols);
      pbVar40 = pbStack_101a0;
      if (pAVar31->num_tg == 1) {
        tile_size_bytes_1 = 4;
        iVar11 = (int)pbVar28 - (int)pbStack_101a0;
        iVar13 = remux_tiles(pCStack_100d8,pbVar28,total_size - iVar11,uVar16,0,&tile_size_bytes_1,
                             &unused);
        total_size = iVar13 + iVar11;
        aom_wb_overwrite_literal(&saved_wb,tile_size_bytes_1 + -1,2);
        aom_uleb_decode(pbVar40 + uVar42,(ulong)(total_size - uVar10),(uint64_t *)tile_buffers,
                        &curr_tg_data_size);
        puVar27 = (uint8_t *)((total_size - uVar10) - curr_tg_data_size);
        if (puVar27 != tile_buffers[0][0].data) {
          aom_uleb_encode((uint64_t)puVar27,curr_tg_data_size,pbVar40 + uVar42,(size_t *)&tile_info)
          ;
          sVar17 = curr_tg_data_size;
          iVar13 = tile_info.mi_row_start;
          if (CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start) < curr_tg_data_size) {
            memmove(pbStack_101a0 + uVar42 + CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start),
                    pbStack_101a0 + uVar42 + curr_tg_data_size,(size_t)tile_buffers[0][0].data);
            total_size = total_size + (iVar13 - (int)sVar17);
          }
        }
      }
    }
  }
  else {
    iVar13 = (pAVar31->common).tiles.rows;
    _Var3 = ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
    if ((pAVar31->ppi->level_params).keep_level_stats != 0) {
      pAVar31->frame_header_count = pAVar31->frame_header_count + 1;
    }
    pMStack_10178 =
         (MACROBLOCKD *)CONCAT44(pMStack_10178._4_4_,iVar13 * (pAVar31->common).tiles.cols);
    *pbStack_101a0 = _Var3 * '\x04' | 0x32;
    if (_Var3 == false) {
      uVar16 = 1;
    }
    else {
      uVar16 = 2;
      pbStack_101a0[1] = (byte)lStack_101a8;
    }
    pbVar28 = pbStack_101a0 + uVar16;
    uStack_100dc = write_frame_header_obu(pAVar31,&(pAVar31->td).mb.e_mbd,&saved_wb,pbVar28,0);
    pbStack_100d0 = (byte *)(ulong)uStack_100dc;
    if ((pAVar31->oxcf).tile_cfg.enable_ext_tile_debug == true) {
      tile_buffers[0][0].size = 0;
      tile_buffers[0][1].data._0_4_ = 0;
      uVar37 = (pAVar31->common).current_frame.frame_number;
      tile_buffers[0][0].data._0_5_ = CONCAT14((char)((ulong)uVar37 / 100) + '0',0x68662f2e);
      uVar8 = CONCAT15((char)((ushort)((ulong)uVar37 % 100) / 10),tile_buffers[0][0].data._0_5_);
      tile_buffers[0][0].data =
           (uint8_t *)(ulong)(CONCAT16((char)((ulong)uVar37 % 10),uVar8) | 0x30300000000000);
      av1_print_uncompressed_frame_header(pbVar28,uStack_100dc,(char *)tile_buffers);
    }
    pbStack_100d0 = pbVar28 + (long)pbStack_100d0;
    uVar37 = (pAVar31->common).tiles.cols;
    uStack_100e8 = (ulong)(int)uVar37;
    uVar14 = (pAVar31->common).tiles.rows;
    pTVar1 = &pAVar31->td;
    (pAVar31->td).interp_filter_selected[2] = 0;
    (pAVar31->td).interp_filter_selected[3] = 0;
    (pAVar31->td).coefficient_size = 0;
    (pAVar31->td).max_mv_magnitude = 0;
    (pAVar31->td).interp_filter_selected[0] = 0;
    (pAVar31->td).interp_filter_selected[1] = 0;
    pbStack_10160 = (byte *)((ulong)(1 < (int)pMStack_10178) << 2);
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    pAVar19 = (AV1_PRIMARY *)0x0;
    if (0 < (int)uVar37) {
      pAVar19 = (AV1_PRIMARY *)(ulong)uVar37;
    }
    lStack_100f0 = uStack_100e8 * 0x5d10;
    pTStack_10170 = tile_buffers[0];
    lStack_10118 = 0x20;
    uStack_1014c = 0;
    paStack_10168 = (aom_metadata_array_t *)((ulong)paStack_10168 & 0xffffffff00000000);
    pAVar26 = (AV1_PRIMARY *)0x0;
    uVar42 = (ulong)uStack_100dc;
    pbStack_10140 = pbVar28;
    while (uVar10 = uStack_100dc, iVar13 = (int)uVar42, pAVar26 != pAVar19) {
      av1_tile_set_col(&tile_info,pAVar29,(int)pAVar26);
      uVar25 = (ulong)(iVar13 + 4);
      if (pAVar26 == (AV1_PRIMARY *)(ulong)(uVar37 - 1)) {
        uVar25 = uVar42;
      }
      uVar32 = (ulong)pAVar26 & 0xffffffff;
      uVar20 = 0xffffffffffffffff;
      lVar23 = lStack_10118;
      pTVar18 = pTStack_10170;
      pAStack_10198 = pAVar26;
      for (lVar43 = 0; (ulong)uVar14 << 10 != lVar43; lVar43 = lVar43 + 0x400) {
        uStack_10188 = CONCAT44(uStack_10188._4_4_,(int)uVar32);
        uVar41 = (int)uVar20 + 1;
        pTVar7 = pAStack_101b0->tile_data;
        lStack_101a8 = lVar23;
        uStack_10190 = uVar20;
        av1_tile_set_row(&tile_info,pAStack_10158,uVar41);
        pAVar31 = pAStack_101b0;
        pbVar28 = pbStack_10140 + uVar25;
        *(byte **)((long)&((TileBufferEnc *)&pTVar18->data)->data + lVar43) = pbVar28;
        (pAStack_101b0->td).mb.e_mbd.tile_ctx =
             (FRAME_CONTEXT *)((long)((pTVar7->tctx).txb_skip_cdf + -1) + 0x2e + lVar23);
        if ((pAStack_101b0->common).tiles.large_scale == 0) {
          bStack_10040 = (pAStack_101b0->common).features.disable_cdf_update ^ 1;
        }
        else {
          bStack_10040 = 0;
        }
        aom_start_encode((aom_writer *)&curr_tg_data_size,pbVar28 + (long)pbStack_10160);
        write_modes(pAVar31,pTVar1,&tile_info,(aom_writer *)&curr_tg_data_size,uVar41,
                    (int)pAStack_10198);
        iVar11 = aom_stop_encode((aom_writer *)&curr_tg_data_size);
        if (iVar11 < 0) {
          aom_internal_error((pAVar31->common).error,AOM_CODEC_ERROR,"Error writing modes");
        }
        pTVar18 = pTStack_10170;
        uVar30 = (uint)curr_tg_data_size;
        uVar20 = curr_tg_data_size & 0xffffffff;
        *(ulong *)((long)&pTStack_10170->size + lVar43) = uVar20;
        if ((uint)paStack_10168 < (uint)curr_tg_data_size) {
          *piStack_10148 = (int)uStack_10188;
          paStack_10168 =
               (aom_metadata_array_t *)CONCAT44(paStack_10168._4_4_,(uint)curr_tg_data_size);
        }
        iVar11 = (int)uStack_10188;
        if (1 < (int)pMStack_10178) {
          iVar34 = (uint)curr_tg_data_size - 1;
          iVar15 = (pAStack_101b0->common).tiles.width;
          iVar4 = (pAStack_101b0->common).tiles.height;
          if (iVar4 < iVar15) {
            iVar4 = iVar15;
          }
          if (((pAStack_101b0->common).current_frame.frame_type != '\0') && (iVar4 * 4 < 0x101)) {
            uVar22 = 0;
            if (lVar43 != 0) {
              uVar5 = **(uint **)((long)&(*(TileBufferEnc (*) [64])(pTStack_10170 + -0x40))[0].data
                                 + lVar43);
              uVar24 = uVar5 >> 0x18 & 0x7f;
              uVar35 = uVar24 + 1;
              if (-1 < (int)uVar5) {
                uVar35 = 1;
              }
              uVar22 = 0;
              if (uVar35 < 0x80) {
                iVar15 = (int)uStack_10190 - uVar24;
                if (-1 < (int)uVar5) {
                  iVar15 = (int)uStack_10190;
                }
                uVar22 = 0;
                if (tile_buffers[iVar15][(long)pAStack_10198].size == uVar20) {
                  uStack_10190 = CONCAT44(uStack_10190._4_4_,iVar34);
                  uStack_100f8 = CONCAT44(uStack_100f8._4_4_,uVar35);
                  iVar11 = bcmp(tile_buffers[iVar15][(long)pAStack_10198].data + 4,pbVar28 + 4,
                                uVar20);
                  uVar22 = (uint)uStack_100f8;
                  if (iVar11 != 0) {
                    uVar22 = 0;
                  }
                  iVar11 = (int)uStack_10188;
                  iVar34 = (int)uStack_10190;
                }
              }
            }
            if (uVar22 != 0) {
              iVar34 = (uVar22 | 0xffffff80) << 0x18;
              uVar30 = 0;
            }
          }
          *(int *)pbVar28 = iVar34;
        }
        uVar25 = (ulong)((int)uVar25 + (int)pbStack_10160 + uVar30);
        uVar32 = (ulong)(uint)(iVar11 + (int)uStack_100e8);
        lVar23 = lStack_101a8 + lStack_100f0;
        uVar20 = (ulong)uVar41;
        pAVar31 = pAStack_101b0;
      }
      if (pAStack_10198 != (AV1_PRIMARY *)(ulong)(uVar37 - 1)) {
        uVar41 = ((int)uVar25 - iVar13) - 4;
        *(uint *)(pbStack_10140 + uVar42) = uVar41;
        if (uStack_1014c <= uVar41) {
          uStack_1014c = uVar41;
        }
      }
      pTStack_10170 = pTVar18 + 1;
      lStack_10118 = lStack_10118 + 0x5d10;
      uVar42 = uVar25;
      pAVar29 = pAStack_10158;
      pAVar26 = (AV1_PRIMARY *)((long)pAStack_10198->parallel_cpi + 1);
    }
    av1_accumulate_pack_bs_thread_data(pAVar31,pTVar1);
    tile_buffers[0][0].data = (uint8_t *)((ulong)tile_buffers[0][0].data & 0xffffffff00000000);
    curr_tg_data_size = curr_tg_data_size & 0xffffffff00000000;
    if (1 < (int)pMStack_10178) {
      iVar13 = remux_tiles(pCStack_100d8,pbStack_100d0,iVar13 - uVar10,(uint)paStack_10168,
                           uStack_1014c,(int *)tile_buffers,(int *)&curr_tg_data_size);
      uVar42 = (ulong)(iVar13 + uVar10);
    }
    pbVar28 = pbStack_10140;
    sVar17 = aom_uleb_size_in_bytes(uVar42);
    memmove(pbVar28 + sVar17,pbVar28,uVar42);
    av1_write_uleb_obu_size_unsafe(uVar42,pbVar28);
    saved_wb.bit_buffer = saved_wb.bit_buffer + sVar17;
    if (1 < (int)pMStack_10178) {
      aom_wb_overwrite_literal(&saved_wb,(uint)curr_tg_data_size + -1,2);
      aom_wb_overwrite_literal(&saved_wb,(int)tile_buffers[0][0].data + -1,2);
    }
    total_size = (int)sVar17 + (int)uVar42 + uVar16;
  }
  pbStack_101a0 = pbStack_101a0 + total_size;
LAB_001943f2:
  *size = (long)pbStack_101a0 - (long)dst;
  return 0;
}

Assistant:

int av1_pack_bitstream(AV1_COMP *const cpi, uint8_t *dst, size_t dst_size,
                       size_t *size, int *const largest_tile_id) {
  uint8_t *data = dst;
  size_t data_size = dst_size;
  AV1_COMMON *const cm = &cpi->common;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  uint32_t obu_header_size = 0;
  uint32_t obu_payload_size = 0;
  FrameHeaderInfo fh_info = { NULL, 0, 0 };
  const uint8_t obu_extension_header =
      cm->temporal_layer_id << 5 | cm->spatial_layer_id << 3 | 0;

  // If no non-zero delta_q has been used, reset delta_q_present_flag
  if (cm->delta_q_info.delta_q_present_flag && cpi->deltaq_used == 0) {
    cm->delta_q_info.delta_q_present_flag = 0;
  }

#if CONFIG_BITSTREAM_DEBUG
  bitstream_queue_reset_write();
#endif

  cpi->frame_header_count = 0;

  // The TD is now written outside the frame encode loop

  // write sequence header obu at each key frame or intra_only frame,
  // preceded by 4-byte size
  if (cm->current_frame.frame_type == INTRA_ONLY_FRAME ||
      cm->current_frame.frame_type == KEY_FRAME) {
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_SEQUENCE_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/false, 0, data);
    assert(obu_header_size <= 2);
    obu_payload_size = av1_write_sequence_header_obu(
        cm->seq_params, data + obu_header_size, data_size - obu_header_size);
    const size_t length_field_size =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field_size == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    const size_t bytes_written =
        obu_header_size + length_field_size + obu_payload_size;
    data += bytes_written;
    data_size -= bytes_written;
  }

  // write metadata obus before the frame obu that has the show_frame flag set
  if (cm->show_frame) {
    const size_t bytes_written = av1_write_metadata_array(cpi, data, data_size);
    data += bytes_written;
    data_size -= bytes_written;
  }

  const int write_frame_header =
      (cpi->num_tg > 1 || encode_show_existing_frame(cm));
  struct aom_write_bit_buffer saved_wb = { NULL, 0 };
  size_t length_field = 0;
  if (write_frame_header) {
    // Write Frame Header OBU.
    fh_info.frame_header = data;
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_FRAME_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extension_header, data);
    // TODO: bug 42302568 - Pass data_size - obu_header_size to
    // write_frame_header_obu().
    obu_payload_size = write_frame_header_obu(cpi, &cpi->td.mb.e_mbd, &saved_wb,
                                              data + obu_header_size, 1);

    length_field =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = obu_header_size + length_field + obu_payload_size;
    // Make sure it is safe to cast fh_info.total_length to uint32_t.
    if (fh_info.total_length > UINT32_MAX) {
      return AOM_CODEC_ERROR;
    }
    data += fh_info.total_length;
    data_size -= fh_info.total_length;
  }

  if (!encode_show_existing_frame(cm)) {
    // Since length_field is determined adaptively after frame header
    // encoding, saved_wb must be adjusted accordingly.
    if (saved_wb.bit_buffer != NULL) {
      saved_wb.bit_buffer += length_field;
    }

    //  Each tile group obu will be preceded by 4-byte size of the tile group
    //  obu
    const size_t bytes_written =
        write_tiles_in_tg_obus(cpi, data, data_size, &saved_wb,
                               obu_extension_header, &fh_info, largest_tile_id);
    data += bytes_written;
    data_size -= bytes_written;
  }
  *size = data - dst;
  (void)data_size;
  return AOM_CODEC_OK;
}